

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_hash_table_based.cpp
# Opt level: O1

void __thiscall
so_5::impl::hash_table_subscr_storage::storage_t::destroy_all_subscriptions(storage_t *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  agent_t *paVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  
  p_Var6 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
    do {
      p_Var2 = p_Var6 + 1;
      if ((p_Var7 == (_Rb_tree_node_base *)0x0) || (*(long *)p_Var7 != *(long *)p_Var2)) {
LAB_00204c8a:
        p_Var3 = p_Var6[1]._M_right;
        paVar5 = subscription_storage_t::owner(&this->super_subscription_storage_t);
        (**(code **)(*(long *)p_Var3 + 0x20))(p_Var3,&p_Var6[1]._M_parent,paVar5);
      }
      else {
        bVar4 = std::type_index::operator==
                          ((type_index *)&p_Var7->_M_parent,(type_index *)&p_Var6[1]._M_parent);
        if (!bVar4) goto LAB_00204c8a;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      p_Var7 = p_Var2;
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  (*(this->super_subscription_storage_t)._vptr_subscription_storage_t[7])(this);
  return;
}

Assistant:

void
storage_t::destroy_all_subscriptions()
	{
		{
			const map_t::value_type * previous = nullptr;
			for( auto & i : m_map )
			{
				// Optimisation: for several consequtive keys with
				// the same (mbox, msg_type) pair it is necessary to
				// call unsubscribe_event_handlers only once.
				if( !previous ||
						!previous->first.is_same_mbox_msg_pair( i.first ) )
					i.second->unsubscribe_event_handlers(
						i.first.m_msg_type,
						owner() );

				previous = &i;
			}
		}

		drop_content();
	}